

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<16U,_float>_>::tsvq_node>::push_back
          (vector<basisu::tree_vector_quant<basisu::vec<16U,_float>_>::tsvq_node> *this,
          tsvq_node *obj)

{
  tsvq_node *ptVar1;
  uint uVar2;
  uint *__dest;
  uint *__src;
  uint64_t uVar3;
  undefined4 uVar4;
  int32_t iVar5;
  uint32_t i;
  tsvq_node *ptVar6;
  long lVar7;
  ulong uVar8;
  
  ptVar6 = this->m_p;
  uVar2 = this->m_size;
  uVar8 = (ulong)uVar2;
  if (ptVar6 + uVar8 <= obj || (obj < ptVar6 || ptVar6 == (tsvq_node *)0x0)) {
    if (this->m_capacity <= uVar2) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this,uVar2 + 1,true,0x70,object_mover,false);
      ptVar6 = this->m_p;
      uVar8 = (ulong)this->m_size;
    }
    uVar4 = *(undefined4 *)&obj->field_0x4;
    uVar3 = obj->m_weight;
    ptVar1 = ptVar6 + uVar8;
    ptVar1->m_var = obj->m_var;
    *(undefined4 *)&ptVar1->field_0x4 = uVar4;
    ptVar1->m_weight = uVar3;
    lVar7 = 0;
    do {
      ptVar6[uVar8].m_origin.m_v[lVar7] = (obj->m_origin).m_v[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    iVar5 = obj->m_right_index;
    ptVar6[uVar8].m_left_index = obj->m_left_index;
    ptVar6[uVar8].m_right_index = iVar5;
    ptVar6[uVar8].m_training_vecs.m_p = (uint *)0x0;
    ptVar6[uVar8].m_training_vecs.m_size = 0;
    ptVar6[uVar8].m_training_vecs.m_capacity = 0;
    elemental_vector::increase_capacity
              ((elemental_vector *)&ptVar6[uVar8].m_training_vecs,(obj->m_training_vecs).m_size,
               false,4,(object_mover)0x0,false);
    uVar2 = (obj->m_training_vecs).m_size;
    ptVar6[uVar8].m_training_vecs.m_size = uVar2;
    __dest = ptVar6[uVar8].m_training_vecs.m_p;
    if ((__dest != (uint *)0x0) && (__src = (obj->m_training_vecs).m_p, __src != (uint *)0x0)) {
      memcpy(__dest,__src,(ulong)uVar2 << 2);
    }
    ptVar6[uVar8].m_codebook_index = obj->m_codebook_index;
    this->m_size = this->m_size + 1;
    return;
  }
  __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x267,
                "void basisu::vector<basisu::tree_vector_quant<basisu::vec<16, float>>::tsvq_node>::push_back(const T &) [T = basisu::tree_vector_quant<basisu::vec<16, float>>::tsvq_node]"
               );
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }